

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::ParseElementHeader
               (IMkvReader *pReader,longlong *pos,longlong stop,longlong *id,longlong *size)

{
  longlong lVar1;
  long *in_RCX;
  long in_RDX;
  IMkvReader *in_RSI;
  longlong in_RDI;
  long *in_R8;
  unsigned_long_long rollover_check;
  long len;
  long local_38;
  IMkvReader *in_stack_fffffffffffffff8;
  long lVar2;
  
  if ((in_RDX < 0) || ((long)in_RSI->_vptr_IMkvReader < in_RDX)) {
    lVar1 = ReadID(in_stack_fffffffffffffff8,in_RDI,(long *)in_RSI);
    *in_RCX = lVar1;
    if (*in_RCX < 0) {
      lVar2 = -2;
    }
    else {
      in_RSI->_vptr_IMkvReader = (_func_int **)(local_38 + (long)in_RSI->_vptr_IMkvReader);
      if ((in_RDX < 0) || ((long)in_RSI->_vptr_IMkvReader < in_RDX)) {
        lVar1 = ReadUInt(in_RSI,in_RDX,in_RCX);
        *in_R8 = lVar1;
        if ((*in_R8 < 0) || ((local_38 < 1 || (8 < local_38)))) {
          lVar2 = -2;
        }
        else if ((ulong)((long)in_RSI->_vptr_IMkvReader + local_38) < 0x8000000000000000) {
          in_RSI->_vptr_IMkvReader = (_func_int **)(local_38 + (long)in_RSI->_vptr_IMkvReader);
          if ((in_RDX < 0) || ((long)in_RSI->_vptr_IMkvReader <= in_RDX)) {
            lVar2 = 0;
          }
          else {
            lVar2 = -2;
          }
        }
        else {
          lVar2 = -2;
        }
      }
      else {
        lVar2 = -2;
      }
    }
  }
  else {
    lVar2 = -2;
  }
  return lVar2;
}

Assistant:

long ParseElementHeader(IMkvReader* pReader, long long& pos, long long stop,
                        long long& id, long long& size) {
  if (stop >= 0 && pos >= stop)
    return E_FILE_FORMAT_INVALID;

  long len;

  id = ReadID(pReader, pos, len);

  if (id < 0)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume id

  if (stop >= 0 && pos >= stop)
    return E_FILE_FORMAT_INVALID;

  size = ReadUInt(pReader, pos, len);

  if (size < 0 || len < 1 || len > 8) {
    // Invalid: Negative payload size, negative or 0 length integer, or integer
    // larger than 64 bits (libwebm cannot handle them).
    return E_FILE_FORMAT_INVALID;
  }

  // Avoid rolling over pos when very close to LLONG_MAX.
  const unsigned long long rollover_check =
      static_cast<unsigned long long>(pos) + len;
  if (rollover_check > LLONG_MAX)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume length of size

  // pos now designates payload

  if (stop >= 0 && pos > stop)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}